

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O2

unsigned_long_long Jupiter_strtoull_nospace(char *str,int base)

{
  byte bVar1;
  int iVar2;
  unsigned_long_long uVar3;
  
  if (*str == '+') {
    str = str + 1;
  }
  else if (*str == '-') {
    iVar2 = Jupiter_strtoi_nospace(str,base);
    return (long)iVar2;
  }
  if (base == 0x10) {
    base = 0x10;
    if (*str == 0x30) {
      if ((((byte *)str)[1] | 0x20) == 0x78) {
        str = (char *)((byte *)str + 2);
      }
      else {
        str = (char *)((byte *)str + 1);
      }
    }
    goto LAB_00138bd2;
  }
  if (base != 0) goto LAB_00138bd2;
  if (*str != 0x30) {
    base = 10;
    goto LAB_00138bd2;
  }
  bVar1 = ((byte *)str)[1];
  if (bVar1 == 0x42) {
LAB_00138bbf:
    str = (char *)((byte *)str + 2);
    base = 2;
  }
  else {
    if (bVar1 != 0x78) {
      if (bVar1 == 0x62) goto LAB_00138bbf;
      if (bVar1 != 0x58) {
        str = (char *)((byte *)str + 1);
        base = 8;
        goto LAB_00138bd2;
      }
    }
    str = (char *)((byte *)str + 2);
    base = 0x10;
  }
LAB_00138bd2:
  uVar3 = 0;
  while ((int)(uint)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                    [(byte)*str] < base) {
    uVar3 = uVar3 * (long)base +
            (ulong)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                   [(byte)*str];
    str = (char *)((byte *)str + 1);
  }
  return uVar3;
}

Assistant:

unsigned long long Jupiter_strtoull_nospace(const char *str, int base)
{
	unsigned long long total = 0;
	int tval;

	if (*str == '-')
		return Jupiter_strtoi_nospace(str, base);

	if (*str == '+')
		++str;

	if (base == 0) // Guess a base.
	{
		if (*str == '0')
		{
			switch (*++str)
			{
			case 'X':
			case 'x':
				++str;
				base = 16;
				break;
			case 'B':
			case 'b':
				++str;
				base = 2;
				break;
			default:
				base = 8;
				break;
			}
		}
		else base = 10;
	}
	else if (base == 16) // check for optional preceeding hexadecimal prefix.
	{
		if (*str == '0')
		{
			++str;
			if (*str == 'x' || *str == 'X')
				++str;
		}
	}

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		++str;
	}

	return total;
}